

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O3

void * __thiscall
vk::AllocationCallbackRecorder::reallocate
          (AllocationCallbackRecorder *this,void *original,size_t size,size_t alignment,
          VkSystemAllocationScope allocationScope)

{
  VkAllocationCallbacks *pVVar1;
  void *pvVar2;
  AllocationCallbackRecord record;
  AllocationCallbackRecord local_60;
  
  pVVar1 = (this->super_ChainedAllocator).m_nextAllocator;
  pvVar2 = (*pVVar1->pfnReallocation)(pVVar1->pUserData,original,size,alignment,allocationScope);
  local_60.type = TYPE_REALLOCATION;
  local_60.data.reallocation.original = original;
  local_60.data.allocation.alignment = size;
  local_60.data.reallocation.alignment = alignment;
  local_60.data.reallocation.scope = allocationScope;
  local_60.data.reallocation.returnedPtr = pvVar2;
  de::AppendList<vk::AllocationCallbackRecord>::append(&this->m_records,&local_60);
  return pvVar2;
}

Assistant:

void* AllocationCallbackRecorder::reallocate (void* original, size_t size, size_t alignment, VkSystemAllocationScope allocationScope)
{
	void* const	ptr	= ChainedAllocator::reallocate(original, size, alignment, allocationScope);

	m_records.append(AllocationCallbackRecord::reallocation(original, size, alignment, allocationScope, ptr));

	return ptr;
}